

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalAnalyzer.cpp
# Opt level: O3

Token * MyCompiler::nextToken(Token *__return_storage_ptr__,istream *stream)

{
  SymbolType SVar1;
  size_type sVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  Token *pTVar8;
  const_iterator cVar9;
  LexicalError *this;
  size_type in_RCX;
  long lVar10;
  size_type extraout_RDX;
  SymbolType *__k;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
  *puVar11;
  undefined4 *puVar12;
  unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
  *puVar13;
  _Alloc_hider _Var14;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  *ppVar15;
  hasher *in_R8;
  key_equal *in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  size_type sVar17;
  byte bVar18;
  initializer_list<std::pair<const_char,_State>_> __l;
  pos_type offset;
  undefined1 auVar19 [16];
  char c;
  string buffer;
  allocator_type *in_stack_fffffffffffffc68;
  SymbolType local_390;
  allocator_type local_38b;
  key_equal local_38a;
  hasher local_389;
  SymbolType local_388;
  SymbolType local_384 [11];
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_238;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_210;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_1c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
  local_58;
  
  bVar18 = 0;
  puVar13 = (unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
             *)stream;
  if ((nextToken(std::istream&)::keywordsMap_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nextToken(std::istream&)::keywordsMap_abi_cxx11_), iVar5 != 0)) {
    local_390 = BEGIN;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_238,(char (*) [6])"begin",&local_390);
    local_384[0] = END;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_210,(char (*) [4])"end",local_384);
    local_388 = IF;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (&local_1e8,(char (*) [3])"if",&local_388);
    local_384[10] = 0x16;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_1c0,(char (*) [5])"then",local_384 + 10);
    local_384[9] = 0x17;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_198,(char (*) [6])"while",local_384 + 9);
    local_384[8] = 0x18;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_170,(char (*) [6])"write",local_384 + 8);
    local_384[7] = 0x19;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_148,(char (*) [5])"read",local_384 + 7);
    local_384[6] = 0x1a;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[3],_MyCompiler::SymbolType,_true>
              (&local_120,(char (*) [3])"do",local_384 + 6);
    local_384[5] = 0x1b;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[5],_MyCompiler::SymbolType,_true>
              (&local_f8,(char (*) [5])"call",local_384 + 5);
    local_384[4] = 0x1c;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[6],_MyCompiler::SymbolType,_true>
              (&local_d0,(char (*) [6])"const",local_384 + 4);
    local_384[3] = 0x1d;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_a8,(char (*) [4])"var",local_384 + 3);
    local_384[2] = 0x1e;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[10],_MyCompiler::SymbolType,_true>
              (&local_80,(char (*) [10])"procedure",local_384 + 2);
    local_384[1] = 0x1f;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
    ::pair<const_char_(&)[4],_MyCompiler::SymbolType,_true>
              (&local_58,(char (*) [4])"odd",local_384 + 1);
    in_stack_fffffffffffffc68 = &local_38b;
    in_R8 = &local_389;
    in_R9 = &local_38a;
    in_RCX = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>,std::allocator<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_Hashtable<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>const*>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>,std::allocator<std::pair<std::__cxx11::string_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&local_238,
               &stack0xffffffffffffffd0);
    lVar10 = -0x208;
    paVar16 = &local_58.first.field_2;
    do {
      if (paVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar16->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar16->_M_allocated_capacity)[-2],
                        paVar16->_M_allocated_capacity + 1);
      }
      paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar16->_M_allocated_capacity + -5);
      lVar10 = lVar10 + 0x28;
    } while (lVar10 != 0);
    puVar11 = &nextToken(std::istream&)::keywordsMap_abi_cxx11_;
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken(std::istream&)::keywordsMap_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::keywordsMap_abi_cxx11_);
    puVar13 = (unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
               *)puVar11;
  }
  if ((nextToken(std::istream&)::startCharsSymbolTypeMap == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsSymbolTypeMap), iVar5 != 0))
  {
    puVar12 = &DAT_00110bd4;
    ppVar15 = &local_238;
    for (lVar10 = 0x16; lVar10 != 0; lVar10 = lVar10 + -1) {
      *(undefined4 *)&(ppVar15->first)._M_dataplus._M_p = *puVar12;
      puVar12 = puVar12 + (ulong)bVar18 * -2 + 1;
      ppVar15 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>
                 *)((long)ppVar15 + (ulong)bVar18 * -8 + 4);
    }
    in_stack_fffffffffffffc68 = (allocator_type *)&local_388;
    in_R8 = (hasher *)&local_390;
    in_R9 = (key_equal *)local_384;
    in_RCX = 0;
    std::
    _Hashtable<char,std::pair<char_const,MyCompiler::SymbolType>,std::allocator<std::pair<char_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_Hashtable<std::pair<char_const,MyCompiler::SymbolType>const*>
              ((_Hashtable<char,std::pair<char_const,MyCompiler::SymbolType>,std::allocator<std::pair<char_const,MyCompiler::SymbolType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&nextToken::startCharsSymbolTypeMap,&local_238,&local_1e8.first._M_string_length);
    puVar13 = &nextToken::startCharsSymbolTypeMap;
    __cxa_atexit(std::
                 unordered_map<char,_MyCompiler::SymbolType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>_>
                 ::~unordered_map,&nextToken::startCharsSymbolTypeMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsSymbolTypeMap);
  }
  if ((nextToken(std::istream&)::startCharsStateMap == '\0') &&
     (iVar5 = __cxa_guard_acquire(&nextToken(std::istream&)::startCharsStateMap), iVar5 != 0)) {
    __l._M_len = extraout_RDX;
    __l._M_array = (iterator)puVar13;
    std::
    unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
    ::unordered_map((unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                     *)&DAT_00110c2c,__l,in_RCX,in_R8,in_R9,in_stack_fffffffffffffc68);
    __cxa_atexit(std::
                 unordered_map<char,_State,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_State>_>_>
                 ::~unordered_map,&nextToken::startCharsStateMap,&__dso_handle);
    __cxa_guard_release(&nextToken(std::istream&)::startCharsStateMap);
  }
  paVar16 = &local_238.first.field_2;
  local_238.first._M_string_length = 0;
  local_238.first.field_2._M_local_buf[0] = '\0';
  local_238.first._M_dataplus._M_p = (pointer)paVar16;
  if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0) {
    iVar5 = 0;
    do {
      cVar4 = (char)&local_238;
      switch(iVar5) {
      case 0:
        std::ws<char,std::char_traits<char>>(stream);
        if (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) != 0) goto LAB_0010e103;
        cVar3 = std::istream::peek();
        local_390 = CONCAT31(local_390._1_3_,cVar3);
        iVar5 = isalpha((int)cVar3);
        if (iVar5 == 0) {
          if (9 < (int)cVar3 - 0x30U) {
            __k = &local_390;
            cVar6 = std::
                    _Hashtable<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&nextToken::startCharsSymbolTypeMap._M_h,(key_type *)__k);
            if (cVar6.
                super__Node_iterator_base<std::pair<const_char,_MyCompiler::SymbolType>,_false>.
                _M_cur == (__node_type *)0x0) {
              cVar7 = std::
                      _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find((_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)(ulong)(byte)(undefined1)local_390,(key_type *)__k);
              if (cVar7.super__Node_iterator_base<std::pair<const_char,_State>,_false>._M_cur ==
                  (__node_type *)0x0) goto LAB_0010e9ba;
              std::istream::get();
              cVar7 = std::
                      _Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find((_Hashtable<char,_std::pair<const_char,_State>,_std::allocator<std::pair<const_char,_State>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                              *)(ulong)(byte)(undefined1)local_390,(key_type *)__k);
              if (cVar7.super__Node_iterator_base<std::pair<const_char,_State>,_false>._M_cur !=
                  (__node_type *)0x0) {
                iVar5 = *(int *)((long)cVar7.
                                       super__Node_iterator_base<std::pair<const_char,_State>,_false>
                                       ._M_cur + 0xc);
                break;
              }
            }
            else {
              std::istream::get();
              cVar6 = std::
                      _Hashtable<char,_std::pair<const_char,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_char,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&nextToken::startCharsSymbolTypeMap._M_h,(key_type *)&local_390);
              if (cVar6.
                  super__Node_iterator_base<std::pair<const_char,_MyCompiler::SymbolType>,_false>.
                  _M_cur != (__node_type *)0x0) {
                SVar1 = *(SymbolType *)
                         ((long)cVar6.
                                super__Node_iterator_base<std::pair<const_char,_MyCompiler::SymbolType>,_false>
                                ._M_cur + 0xc);
                local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
                std::__cxx11::string::_M_construct((ulong)&local_258,'\x01');
                Token::Token(__return_storage_ptr__,SVar1,&local_258);
                local_2b8.field_2._M_allocated_capacity = local_258.field_2._M_allocated_capacity;
                _Var14._M_p = local_258._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_258._M_dataplus._M_p != &local_258.field_2) goto LAB_0010e649;
                goto LAB_0010e651;
              }
            }
            std::__throw_out_of_range("_Map_base::at");
LAB_0010e9ba:
            this = (LexicalError *)__cxa_allocate_exception(0x20);
            auVar19 = std::istream::tellg();
            offset._M_state = auVar19._8_8_;
            offset._M_off = auVar19._0_8_ + 1;
            LexicalError::LexicalError(this,offset);
            __cxa_throw(this,&LexicalError::typeinfo,std::runtime_error::~runtime_error);
          }
          std::istream::get();
          iVar5 = 2;
          std::__cxx11::string::push_back(cVar4);
        }
        else {
          std::istream::get();
          iVar5 = 1;
          std::__cxx11::string::push_back(cVar4);
        }
        break;
      case 1:
        cVar3 = std::istream::peek();
        iVar5 = isalnum((int)cVar3);
        sVar2 = local_238.first._M_string_length;
        _Var14._M_p = local_238.first._M_dataplus._M_p;
        if (iVar5 == 0) {
          if (local_238.first._M_string_length != 0) {
            sVar17 = 0;
            do {
              iVar5 = tolower((int)_Var14._M_p[sVar17]);
              _Var14._M_p[sVar17] = (char)iVar5;
              sVar17 = sVar17 + 1;
            } while (sVar2 != sVar17);
          }
          cVar9 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(&nextToken(std::istream&)::keywordsMap_abi_cxx11_._M_h,&local_238.first);
          if (cVar9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
              ._M_cur == (__node_type *)0x0) {
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2f8,local_238.first._M_dataplus._M_p,
                       local_238.first._M_dataplus._M_p + local_238.first._M_string_length);
            Token::Token(__return_storage_ptr__,IDENT,&local_2f8);
            local_2b8.field_2._M_allocated_capacity = local_2f8.field_2._M_allocated_capacity;
            _Var14._M_p = local_2f8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p == &local_2f8.field_2) goto LAB_0010e651;
          }
          else {
            SVar1 = *(SymbolType *)
                     ((long)cVar9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MyCompiler::SymbolType>,_true>
                            ._M_cur + 0x28);
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2d8,local_238.first._M_dataplus._M_p,
                       local_238.first._M_dataplus._M_p + local_238.first._M_string_length);
            Token::Token(__return_storage_ptr__,SVar1,&local_2d8);
            local_2b8.field_2._M_allocated_capacity = local_2d8.field_2._M_allocated_capacity;
            _Var14._M_p = local_2d8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p == &local_2d8.field_2) goto LAB_0010e651;
          }
LAB_0010e649:
          operator_delete(_Var14._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          goto LAB_0010e651;
        }
        std::istream::get();
        iVar5 = 1;
        std::__cxx11::string::push_back(cVar4);
        break;
      case 2:
        cVar3 = std::istream::peek();
        if (9 < (int)cVar3 - 0x30U) {
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_318,local_238.first._M_dataplus._M_p,
                     local_238.first._M_dataplus._M_p + local_238.first._M_string_length);
          Token::Token(__return_storage_ptr__,NUMBER,&local_318);
          local_2b8.field_2._M_allocated_capacity = local_318.field_2._M_allocated_capacity;
          _Var14._M_p = local_318._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_318._M_dataplus._M_p != &local_318.field_2) goto LAB_0010e649;
          goto LAB_0010e651;
        }
        std::istream::get();
        iVar5 = 2;
        std::__cxx11::string::push_back(cVar4);
        break;
      case 3:
        cVar4 = std::istream::peek();
        if (cVar4 == '=') {
          std::istream::get();
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"<=","");
          Token::Token(__return_storage_ptr__,LEQ,&local_278);
          local_2b8.field_2._M_allocated_capacity = local_278.field_2._M_allocated_capacity;
          _Var14._M_p = local_278._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) goto LAB_0010e649;
          goto LAB_0010e651;
        }
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"<","");
        Token::Token(__return_storage_ptr__,LSS,&local_338);
        local_2b8.field_2._M_allocated_capacity = local_338.field_2._M_allocated_capacity;
        _Var14._M_p = local_338._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) goto LAB_0010e649;
        goto LAB_0010e651;
      case 4:
        cVar4 = std::istream::peek();
        if (cVar4 == '=') {
          std::istream::get();
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,">=","");
          Token::Token(__return_storage_ptr__,GEQ,&local_298);
          local_2b8.field_2._M_allocated_capacity = local_298.field_2._M_allocated_capacity;
          _Var14._M_p = local_298._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) goto LAB_0010e649;
          goto LAB_0010e651;
        }
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,">","");
        Token::Token(__return_storage_ptr__,GTR,&local_358);
        local_2b8.field_2._M_allocated_capacity = local_358.field_2._M_allocated_capacity;
        _Var14._M_p = local_358._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) goto LAB_0010e649;
        goto LAB_0010e651;
      default:
        cVar4 = std::istream::peek();
        if (cVar4 == '=') {
          std::istream::get();
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,":=","");
          Token::Token(__return_storage_ptr__,BECOMES,&local_2b8);
          _Var14._M_p = local_2b8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_0010e649;
          goto LAB_0010e651;
        }
        goto LAB_0010e3c4;
      }
    } while (*(int *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) == 0);
LAB_0010e3c4:
    if (iVar5 - 1U < 5) {
      pTVar8 = (Token *)(*(code *)(&DAT_00110bc0 + *(int *)(&DAT_00110bc0 + (ulong)(iVar5 - 1U) * 4)
                                  ))();
      return pTVar8;
    }
  }
LAB_0010e103:
  Token::Token(__return_storage_ptr__,NUL);
LAB_0010e651:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.first._M_dataplus._M_p != paVar16) {
    operator_delete(local_238.first._M_dataplus._M_p,
                    CONCAT71(local_238.first.field_2._M_allocated_capacity._1_7_,
                             local_238.first.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

MyCompiler::Token MyCompiler::nextToken(std::istream &stream)
{
    enum class State
    {
        START, WORD, NUM, LT, GT, COLON
    };
    static const std::unordered_map<std::string, SymbolType> keywordsMap = {
            {"begin",     SymbolType::BEGIN},
            {"end",       SymbolType::END},
            {"if",        SymbolType::IF},
            {"then",      SymbolType::THEN},
            {"while",     SymbolType::WHILE},
            {"write",     SymbolType::WRITE},
            {"read",      SymbolType::READ},
            {"do",        SymbolType::DO},
            {"call",      SymbolType::CALL},
            {"const",     SymbolType::CONST},
            {"var",       SymbolType::VAR},
            {"procedure", SymbolType::PROC},
            {"odd",       SymbolType::ODD}
    };
    static const std::unordered_map<char, SymbolType> startCharsSymbolTypeMap = {
            {'+', SymbolType::PLUS},
            {'-', SymbolType::MINUS},
            {'*', SymbolType::TIMES},
            {'/', SymbolType::SLASH},
            {'=', SymbolType::EQL},
            {'#', SymbolType::NEQ},
            {'(', SymbolType::LPAREN},
            {')', SymbolType::RPAREN},
            {',', SymbolType::COMMA},
            {';', SymbolType::SEMICOLON},
            {'.', SymbolType::PERIOD}
    };
    static const std::unordered_map<char, State> startCharsStateMap = {
            {'<', State::LT},
            {'>', State::GT},
            {':', State::COLON}
    };

    std::string buffer;
    State state = State::START;
    while (stream.good())
    {
        if (state == State::START)
        {
            std::ws(stream);
            if (!stream.good())
                break;
            char c = stream.peek();
            if (std::isalpha(c))
            {
                buffer.push_back(stream.get());
                state = State::WORD;
            }
            else if (std::isdigit(c))
            {
                buffer.push_back(stream.get());
                state = State::NUM;
            }
            else if (startCharsSymbolTypeMap.find(c) != startCharsSymbolTypeMap.end())
            {
                stream.get();
                return Token(startCharsSymbolTypeMap.at(c), std::string(1, c));
            }
            else if (startCharsStateMap.find(c) != startCharsStateMap.end())
            {
                stream.get();
                state = startCharsStateMap.at(c);
            }
            else
                throw LexicalError(stream.tellg() + std::ios::pos_type(1));
        }
        else if (state == State::WORD)
        {
            char c = stream.peek();
            if (std::isalnum(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::NUM)
        {
            char c = stream.peek();
            if (std::isdigit(c))
                buffer.push_back(stream.get());
            else
                break;
        }
        else if (state == State::LT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::LEQ, "<=");
            }
            else
                break;
        }
        else if (state == State::GT)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::GEQ, ">=");
            }
            else
                break;
        }
        else // if (state == State::COLON)
        {
            char c = stream.peek();
            if (c == '=')
            {
                stream.get();
                return Token(SymbolType::BECOMES, ":=");
            }
            else
                break;
        }
    }
    if (state == State::WORD)
    {
        std::transform(buffer.begin(), buffer.end(), buffer.begin(), ::tolower);
        auto search = keywordsMap.find(buffer);
        if (search != keywordsMap.end())
            return Token(search->second, buffer);
        else
            return Token(SymbolType::IDENT, buffer);
    }
    else if (state == State::NUM)
        return Token(SymbolType::NUMBER, buffer);
    else if (state == State::LT)
        return Token(SymbolType::LSS, "<");
    else if (state == State::GT)
        return Token(SymbolType::GTR, ">");
    else if (state == State::COLON)
        throw LexicalError(stream.tellg());
    else
        return Token(SymbolType::NUL);
}